

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j,short *data,stbi__huffman *hdc,int b)

{
  stbi__uint32 sVar1;
  ushort uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  byte bVar8;
  int iVar9;
  ushort uVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  long in_FS_OFFSET;
  
  if (j->spec_end != 0) {
    *(char **)(in_FS_OFFSET + -0x20) = "can\'t merge dc and ac";
    return 0;
  }
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  if (j->succ_high != 0) {
    iVar9 = j->code_bits;
    if (iVar9 < 1) {
      stbi__grow_buffer_unsafe(j);
      iVar9 = j->code_bits;
      if (iVar9 < 1) {
        return 1;
      }
    }
    sVar1 = j->code_buffer;
    j->code_buffer = sVar1 * 2;
    j->code_bits = iVar9 + -1;
    if (-1 < (int)sVar1) {
      return 1;
    }
    *data = *data + (short)(1 << ((byte)j->succ_low & 0x1f));
    return 1;
  }
  data[0x38] = 0;
  data[0x39] = 0;
  data[0x3a] = 0;
  data[0x3b] = 0;
  data[0x3c] = 0;
  data[0x3d] = 0;
  data[0x3e] = 0;
  data[0x3f] = 0;
  data[0x30] = 0;
  data[0x31] = 0;
  data[0x32] = 0;
  data[0x33] = 0;
  data[0x34] = 0;
  data[0x35] = 0;
  data[0x36] = 0;
  data[0x37] = 0;
  data[0x28] = 0;
  data[0x29] = 0;
  data[0x2a] = 0;
  data[0x2b] = 0;
  data[0x2c] = 0;
  data[0x2d] = 0;
  data[0x2e] = 0;
  data[0x2f] = 0;
  data[0x20] = 0;
  data[0x21] = 0;
  data[0x22] = 0;
  data[0x23] = 0;
  data[0x24] = 0;
  data[0x25] = 0;
  data[0x26] = 0;
  data[0x27] = 0;
  data[0x18] = 0;
  data[0x19] = 0;
  data[0x1a] = 0;
  data[0x1b] = 0;
  data[0x1c] = 0;
  data[0x1d] = 0;
  data[0x1e] = 0;
  data[0x1f] = 0;
  data[0x10] = 0;
  data[0x11] = 0;
  data[0x12] = 0;
  data[0x13] = 0;
  data[0x14] = 0;
  data[0x15] = 0;
  data[0x16] = 0;
  data[0x17] = 0;
  data[8] = 0;
  data[9] = 0;
  data[10] = 0;
  data[0xb] = 0;
  data[0xc] = 0;
  data[0xd] = 0;
  data[0xe] = 0;
  data[0xf] = 0;
  data[0] = 0;
  data[1] = 0;
  data[2] = 0;
  data[3] = 0;
  data[4] = 0;
  data[5] = 0;
  data[6] = 0;
  data[7] = 0;
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar14 = j->code_buffer;
  uVar6 = (ulong)hdc->fast[uVar14 >> 0x17];
  if (uVar6 == 0xff) {
    lVar12 = 0;
    do {
      lVar11 = lVar12;
      lVar12 = lVar11 + 1;
    } while (hdc->maxcode[lVar11 + 10] <= uVar14 >> 0x10);
    iVar9 = j->code_bits;
    if (lVar12 == 8) {
      j->code_bits = iVar9 + -0x10;
    }
    else if (((int)(lVar11 + 10) <= iVar9) &&
            (uVar13 = (uVar14 >> (0x17U - (char)lVar12 & 0x1f) & stbi__bmask[lVar11 + 10]) +
                      hdc->delta[lVar11 + 10], uVar13 < 0x100)) {
      iVar9 = (iVar9 - (int)lVar12) + -9;
      j->code_bits = iVar9;
      j->code_buffer = uVar14 << ((byte)(lVar11 + 10) & 0x1f);
      uVar6 = (ulong)uVar13;
      goto LAB_0011ed24;
    }
  }
  else {
    bVar8 = hdc->size[uVar6];
    iVar9 = j->code_bits - (uint)bVar8;
    if ((int)(uint)bVar8 <= j->code_bits) {
      j->code_buffer = uVar14 << (bVar8 & 0x1f);
      j->code_bits = iVar9;
LAB_0011ed24:
      bVar8 = hdc->values[uVar6];
      if (bVar8 < 0x10) {
        uVar14 = 0;
        if (bVar8 != 0) {
          if (iVar9 < (int)(uint)bVar8) {
            stbi__grow_buffer_unsafe(j);
            iVar9 = j->code_bits;
          }
          uVar14 = 0;
          if ((int)(uint)bVar8 <= iVar9) {
            uVar14 = j->code_buffer;
            uVar4 = uVar14 << (bVar8 & 0x1f) | uVar14 >> 0x20 - (bVar8 & 0x1f);
            uVar13 = stbi__bmask[bVar8];
            j->code_buffer = ~uVar13 & uVar4;
            j->code_bits = iVar9 - (uint)bVar8;
            iVar9 = 0;
            if (-1 < (int)uVar14) {
              iVar9 = stbi__jbias[bVar8];
            }
            uVar14 = iVar9 + (uVar4 & uVar13);
          }
        }
        uVar13 = j->img_comp[b].dc_pred;
        if (-1 < (int)(uVar13 ^ uVar14)) {
          bVar3 = (int)(uVar14 ^ 0x7fffffff) < (int)uVar13;
          if ((int)(uVar13 & uVar14) < 0) {
            bVar3 = (int)uVar13 < (int)(-0x80000000 - uVar14);
          }
          if (bVar3) {
            pcVar7 = "bad delta";
            goto LAB_0011eee2;
          }
        }
        iVar9 = uVar13 + uVar14;
        j->img_comp[b].dc_pred = iVar9;
        bVar8 = (byte)j->succ_low;
        uVar14 = 1 << (bVar8 & 0x1f);
        uVar2 = (ushort)uVar14;
        if ((ushort)(uVar2 + 1) < 2) {
LAB_0011ef14:
          *data = (short)(iVar9 << (bVar8 & 0x1f));
          return 1;
        }
        uVar10 = (ushort)iVar9;
        if ((short)(uVar2 ^ uVar10) < 0) {
          iVar5 = -0x8000 / ((0x10000 << (bVar8 & 0x1f)) >> 0x10);
          if ((short)uVar2 < 0) {
            if ((short)uVar10 <= iVar5) goto LAB_0011ef14;
          }
          else if (iVar5 <= (short)uVar10) goto LAB_0011ef14;
        }
        else if ((short)uVar10 <= (short)(0x7fff / (uVar14 & 0xffff))) goto LAB_0011ef14;
      }
    }
  }
  pcVar7 = "can\'t merge dc and ac";
LAB_0011eee2:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar7;
  return 0;
}

Assistant:

static int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j, short data[64], stbi__huffman *hdc, int b)
{
   int diff,dc;
   int t;
   if (j->spec_end != 0) return stbi__err("can't merge dc and ac", "Corrupt JPEG");

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);

   if (j->succ_high == 0) {
      // first scan for DC coefficient, must be first
      memset(data,0,64*sizeof(data[0])); // 0 all the ac values now
      t = stbi__jpeg_huff_decode(j, hdc);
      if (t < 0 || t > 15) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      diff = t ? stbi__extend_receive(j, t) : 0;

      if (!stbi__addints_valid(j->img_comp[b].dc_pred, diff)) return stbi__err("bad delta", "Corrupt JPEG");
      dc = j->img_comp[b].dc_pred + diff;
      j->img_comp[b].dc_pred = dc;
      if (!stbi__mul2shorts_valid(dc, 1 << j->succ_low)) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      data[0] = (short) (dc * (1 << j->succ_low));
   } else {
      // refinement scan for DC coefficient
      if (stbi__jpeg_get_bit(j))
         data[0] += (short) (1 << j->succ_low);
   }
   return 1;
}